

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

hash_t __thiscall duckdb::Expression::Hash(Expression *this)

{
  hash_t hVar1;
  hash_t right;
  anon_class_8_1_898c6e0c *in_RDI;
  hash_t hash;
  undefined8 in_stack_ffffffffffffffd8;
  Expression *in_stack_ffffffffffffffe0;
  
  hVar1 = Hash<unsigned_int>(0);
  right = LogicalType::Hash((LogicalType *)0xe70719);
  hVar1 = CombineHash(hVar1,right);
  ::std::function<void(duckdb::Expression_const&)>::
  function<duckdb::Expression::Hash()const::__0,void>
            ((function<void_(const_duckdb::Expression_&)> *)&stack0xffffffffffffffd0,in_RDI);
  ExpressionIterator::EnumerateChildren
            (in_stack_ffffffffffffffe0,
             (function<void_(const_duckdb::Expression_&)> *)in_stack_ffffffffffffffd8);
  ::std::function<void_(const_duckdb::Expression_&)>::~function
            ((function<void_(const_duckdb::Expression_&)> *)0xe70764);
  return hVar1;
}

Assistant:

hash_t Expression::Hash() const {
	hash_t hash = duckdb::Hash<uint32_t>(static_cast<uint32_t>(type));
	hash = CombineHash(hash, return_type.Hash());
	ExpressionIterator::EnumerateChildren(*this,
	                                      [&](const Expression &child) { hash = CombineHash(child.Hash(), hash); });
	return hash;
}